

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

Object * env_get(Object *__return_storage_ptr__,char *identifer,int line,Environment *env)

{
  Instance *pIVar1;
  anon_union_8_4_50a03f35_for_Literal_2 aVar2;
  undefined8 uVar3;
  char **ppcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ObjectType OVar7;
  undefined4 uVar8;
  Record *pRVar9;
  
  pRVar9 = env_match(identifer,env);
  if (pRVar9 == (Record *)0x0) {
    printf("\x1b[31m\n[Runtime Error] [Line:%d] Undefined variable %s!\x1b[0m",(ulong)(uint)line,
           identifer);
    stop();
  }
  OVar7 = (pRVar9->object).type;
  uVar8 = *(undefined4 *)&(pRVar9->object).field_0x4;
  pIVar1 = (pRVar9->object).field_1.instance;
  aVar2 = (pRVar9->object).field_1.literal.field_2;
  uVar3 = *(undefined8 *)((long)&(pRVar9->object).field_1 + 0x10);
  ppcVar4 = (pRVar9->object).field_1.routine.arguments;
  uVar5 = *(undefined8 *)((long)&(pRVar9->object).field_1 + 0x20);
  uVar6 = *(undefined8 *)((long)&(pRVar9->object).field_1 + 0x30);
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) =
       *(undefined8 *)((long)&(pRVar9->object).field_1 + 0x28);
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = uVar6;
  (__return_storage_ptr__->field_1).routine.arguments = ppcVar4;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = uVar5;
  (__return_storage_ptr__->field_1).literal.field_2 = aVar2;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = uVar3;
  __return_storage_ptr__->type = OVar7;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar8;
  (__return_storage_ptr__->field_1).instance = pIVar1;
  return __return_storage_ptr__;
}

Assistant:

Object env_get(char *identifer, int line, Environment *env){
    Record *get = env_match(identifer, env);
    if(get == NULL){
        printf(runtime_error("Undefined variable %s!"), line, identifer);
        stop();
    }
   // else if(get->object.type == OBJECT_ARRAY){
   //     printf(runtime_error("%s is an array and cannot be accessed directly!"), line, identifer);
   //     stop();
   // }
    return get->object;
}